

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O3

void merge_2way_unstable(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **result)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  uchar *__s1;
  uchar *__s2;
  long lVar5;
  uchar **local_38;
  
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"merge_2way_unstable",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(), n0=",7);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", n1=",5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  local_38 = from1;
  do {
    __s1 = *from0;
    if (__s1 == (uchar *)0x0) {
LAB_002334c5:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                    ,0x36,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2 = *local_38;
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                    ,0x37,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar2 = strcmp((char *)__s1,(char *)__s2);
    if (0 < iVar2) goto LAB_0023321b;
    if (iVar2 != 0) {
      while( true ) {
        lVar5 = 0;
        do {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tstate_0lt1\n",0xc);
          iVar2 = strcmp((char *)__s1,(char *)__s2);
          if (-1 < iVar2) {
            __assert_fail("cmp(key0, key1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                          ,0x52,
                          "void merge_2way_unstable(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          *(uchar **)((long)result + lVar5) = __s1;
          if (n0 == 1) {
            result = (uchar **)((long)result + lVar5 + 8);
            goto LAB_00233436;
          }
          __s1 = *(uchar **)((long)from0 + lVar5 + 8);
          if (__s1 == (uchar *)0x0) goto LAB_002334c5;
          iVar3 = strcmp((char *)__s1,(char *)__s2);
          iVar2 = (uint)(iVar3 == 0) << 2;
          if (iVar3 < 0) {
            iVar2 = 5;
          }
          lVar5 = lVar5 + 8;
          n0 = n0 - 1;
        } while (iVar2 == 5);
        if (iVar2 == 4) {
          result = (uchar **)((long)result + lVar5);
          from0 = (uchar **)((long)from0 + lVar5);
          goto LAB_002333a6;
        }
        if (iVar2 == 1) {
          return;
        }
        result = (uchar **)((long)result + lVar5);
        from0 = (uchar **)((long)from0 + lVar5);
LAB_0023321b:
        lVar5 = 0;
        do {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tstate_1lt0\n",0xc);
          iVar2 = strcmp((char *)__s2,(char *)__s1);
          if (-1 < iVar2) {
            __assert_fail("cmp(key1, key0) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                          ,0x5f,
                          "void merge_2way_unstable(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          *(uchar **)((long)result + lVar5) = __s2;
          if (n1 == 1) {
            if (n0 == 0) goto LAB_0023344f;
            result = (uchar **)((long)result + lVar5 + 8);
            goto LAB_0023344a;
          }
          __s2 = *(uchar **)((long)local_38 + lVar5 + 8);
          if (__s2 == (uchar *)0x0) goto LAB_002334c5;
          iVar2 = strcmp((char *)__s2,(char *)__s1);
          cVar1 = (iVar2 != 0) * '\x05';
          if (iVar2 < 0) {
            cVar1 = '\x03';
          }
          lVar5 = lVar5 + 8;
          n1 = n1 - 1;
        } while (cVar1 == '\x03');
        result = (uchar **)((long)result + lVar5);
        if (cVar1 == '\0') break;
        local_38 = (uchar **)((long)local_38 + lVar5);
      }
      local_38 = (uchar **)((long)local_38 + lVar5);
    }
LAB_002333a6:
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tstate_0eq1\n",0xc);
    iVar2 = strcmp((char *)__s1,(char *)__s2);
    if (iVar2 != 0) {
      __assert_fail("cmp(key0, key1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                    ,0x6c,
                    "void merge_2way_unstable(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    *result = __s1;
    result[1] = __s2;
    result = result + 2;
    local_38 = local_38 + 1;
    n1 = n1 - 1;
    n0 = n0 - 1;
    if (n0 == 0) {
LAB_00233436:
      from0 = local_38;
      n0 = n1;
      if (n1 == 0) goto LAB_0023344f;
      goto LAB_0023344a;
    }
    from0 = from0 + 1;
    if (n1 == 0) {
LAB_0023344a:
      memcpy(result,from0,n0 << 3);
LAB_0023344f:
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                          __debug_indent_str_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"~",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"merge_2way_unstable",0x13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      return;
    }
  } while( true );
}

Assistant:

static void
merge_2way_unstable(unsigned char** restrict from0, size_t n0,
                    unsigned char** restrict from1, size_t n1,
                    unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	unsigned char* key0 = *from0;
	unsigned char* key1 = *from1;
initial:
	const int cmp01 = cmp(key0, key1);
	if (cmp01 > 0)  goto state_1lt0;
	if (cmp01 == 0) goto state_0eq1;
	// Fall through.
state_0lt1:
{
	debug() << "\tstate_0lt1\n";
	assert(cmp(key0, key1) <  0);
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp_0_1 = cmp(key0, key1);
	if (cmp_0_1 <  0) goto state_0lt1;
	if (cmp_0_1 == 0) goto state_0eq1;
	// Fall through.
}
state_1lt0:
{
	debug() << "\tstate_1lt0\n";
	assert(cmp(key1, key0) <  0);
	*result++ = key1;
	if (--n1 == 0) goto finish1;
	++from1;
	key1 = *from1;
	const int cmp_1_0 = cmp(key1, key0);
	if (cmp_1_0 < 0) goto state_1lt0;
	if (cmp_1_0 > 0) goto state_0lt1;
	// Fall through.
}
state_0eq1:
{
	debug() << "\tstate_0eq1\n";
	assert(cmp(key0, key1) == 0);
	*result++ = key0;
	*result++ = key1;
	++from0;
	++from1;
	--n0;
	--n1;
	if (n0 == 0) goto finish0;
	if (n1 == 0) goto finish1;
	key0 = *from0;
	key1 = *from1;
	goto initial;
}
finish0:
	assert(n0==0);
	if (n1) (void) memcpy(result, from1, n1*sizeof(unsigned char*));
	debug()<< "~" << __func__ << "\n";
	return;
finish1:
	assert(n1==0);
	if (n0) (void) memcpy(result, from0, n0*sizeof(unsigned char*));
	debug()<< "~" << __func__ << "\n";
	return;
}